

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void showMF(string *mySet,MultiFab *mf,string *name,int lev,int iter,int step)

{
  ostringstream *poVar1;
  bool bVar2;
  Format fmt;
  size_type sVar3;
  ostream *os_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_218;
  string junkname;
  string DebugDir;
  Print local_1b8;
  
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(anonymous_namespace)::ShowMF_Sets_abi_cxx11_,mySet);
  if (sVar3 != 0) {
    fmt = amrex::FArrayBox::getFormat();
    amrex::FArrayBox::setFormat((anonymous_namespace)::ShowMF_Fab_Format);
    std::__cxx11::string::string
              ((string *)&DebugDir,(string *)(anonymous_namespace)::ShowMF_Dir_abi_cxx11_);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      bVar2 = amrex::UtilCreateDirectory(&DebugDir,0x1ed,false);
      if (!bVar2) {
        amrex::CreateDirectoryFailed(&DebugDir);
      }
    }
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    std::__cxx11::string::string((string *)&junkname,(string *)name);
    if (-1 < lev) {
      std::operator+(&bStack_218,&junkname,"_");
      amrex::Concatenate((string *)&local_1b8,&bStack_218,lev,1);
      std::__cxx11::string::operator=((string *)&junkname,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&bStack_218);
    }
    if (-1 < iter) {
      std::operator+(&bStack_218,&junkname,"_");
      amrex::Concatenate((string *)&local_1b8,&bStack_218,iter,1);
      std::__cxx11::string::operator=((string *)&junkname,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&bStack_218);
    }
    if (-1 < step) {
      std::operator+(&bStack_218,&junkname,"_");
      amrex::Concatenate((string *)&local_1b8,&bStack_218,step,5);
      std::__cxx11::string::operator=((string *)&junkname,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&bStack_218);
    }
    std::operator+(&bStack_218,&DebugDir,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                   &bStack_218,&junkname);
    std::__cxx11::string::operator=((string *)&junkname,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&bStack_218);
    if ((anonymous_namespace)::ShowMF_Verbose == '\x01') {
      os_ = amrex::OutStream();
      amrex::Print::Print(&local_1b8,os_);
      poVar1 = &local_1b8.ss;
      std::operator<<((ostream *)poVar1,"   ******************************  Debug: writing ");
      std::operator<<((ostream *)poVar1,(string *)&junkname);
      std::operator<<((ostream *)poVar1,'\n');
      amrex::Print::~Print(&local_1b8);
    }
    amrex::VisMF::Write(&mf->super_FabArray<amrex::FArrayBox>,&junkname,NFiles,false);
    amrex::FArrayBox::setFormat(fmt);
    std::__cxx11::string::~string((string *)&junkname);
    std::__cxx11::string::~string((string *)&DebugDir);
  }
  return;
}

Assistant:

void
showMF(const std::string&   mySet,
       const MultiFab&      mf,
       const std::string&   name,
       int                  lev = -1,
       int                  iter = -1, // Default value = no append 2nd integer
       int                  step = -1) // Default value = no append 3nd integer
{
  if (ShowMF_Sets.count(mySet)>0)
  {
    const FABio::Format saved_format = FArrayBox::getFormat();
    FArrayBox::setFormat(ShowMF_Fab_Format);
    std::string DebugDir(ShowMF_Dir);
    if (ParallelDescriptor::IOProcessor())
      if (!amrex::UtilCreateDirectory(DebugDir, 0755))
        amrex::CreateDirectoryFailed(DebugDir);
    ParallelDescriptor::Barrier();

    std::string junkname = name;
    if (lev>=0) {
      junkname = amrex::Concatenate(junkname+"_",lev,1);
    }
    if (iter>=0) {
      junkname = amrex::Concatenate(junkname+"_",iter,1);
    }
    if (step>=0) {
      junkname = amrex::Concatenate(junkname+"_",step,5);
    }
    junkname = DebugDir + "/" + junkname;

    if (ShowMF_Verbose>0) {
      amrex::Print() << "   ******************************  Debug: writing "
             << junkname << '\n';
    }

#if 0
    if (ShowMF_Check_Nans)
    {
      for (MFIter mfi(mf); mfi.isValid(); ++mfi)
      {
        //                AMREX_ASSERT(!mf[mfi].contains_nan(mfi.validbox(),0,mf.nComp()));
      }
    }
#endif
    VisMF::Write(mf,junkname);
    FArrayBox::setFormat(saved_format);
  }
}